

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeDriverGetIpcProperties
          (ze_driver_handle_t hDriver,ze_driver_ipc_properties_t *pIpcProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010d1b0 != (code *)0x0) {
    zVar1 = (*DAT_0010d1b0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetIpcProperties(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        ze_driver_ipc_properties_t* pIpcProperties      ///< [in,out] query result for IPC properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetIpcProperties = context.zeDdiTable.Driver.pfnGetIpcProperties;
        if( nullptr != pfnGetIpcProperties )
        {
            result = pfnGetIpcProperties( hDriver, pIpcProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }